

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
ClearAllocators(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  FreeObject *this_01;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_02;
  
  this_02 = &this->allocatorHead;
  do {
    SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
    Clear(this_02);
    this_02 = this_02->next;
  } while (this_02 != &this->allocatorHead);
  this_01 = this->explicitFreeList;
  if (this_01 != (FreeObject *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (((ulong)this_01 & 0xf) == 0 && (FreeObject *)0xffff < this_01) {
        this_00 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                  HeapBlockMap64::GetHeapBlock
                            (&((this->super_HeapBucket).heapInfo)->recycler->heapBlockMap,this_01);
      }
      else {
        this_00 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      }
      if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x109,"(heapBlock != nullptr)","heapBlock != nullptr");
        if (!bVar2) goto LAB_006cb4f1;
        *puVar3 = 0;
      }
      if ((this_00->super_HeapBlock).heapBlockType == LargeBlockType) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                           ,0x10a,"(!heapBlock->IsLargeHeapBlock())",
                           "!heapBlock->IsLargeHeapBlock()");
        if (!bVar2) {
LAB_006cb4f1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      SmallHeapBlockT<SmallAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                (this_00,this_01);
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  this->explicitFreeList = (FreeObject *)0x0;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::ClearAllocators()
{
    ForEachAllocator([](TBlockAllocatorType * allocator) { ClearAllocator(allocator); });

#ifdef RECYCLER_PAGE_HEAP

#endif

#ifdef RECYCLER_MEMORY_VERIFY
    FreeObject* freeObject = this->explicitFreeList;

    while (freeObject)
    {
        HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock((void*)freeObject);
        Assert(heapBlock != nullptr);
        Assert(!heapBlock->IsLargeHeapBlock());
        TBlockType* smallBlock = (TBlockType*)heapBlock;

        smallBlock->ClearExplicitFreeBitForObject((void*)freeObject);
        freeObject = freeObject->GetNext();
    }
#endif

    this->explicitFreeList = nullptr;
}